

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGuiStb::STB_TEXTEDIT_LAYOUTROW(StbTexteditRow *r,ImGuiTextEditState *obj,int line_start_idx)

{
  unsigned_short *puVar1;
  ImVec2 IVar2;
  float local_38;
  float fStack_34;
  ImVec2 size;
  ImWchar *text_remaining;
  ImWchar *text;
  int line_start_idx_local;
  ImGuiTextEditState *obj_local;
  StbTexteditRow *r_local;
  
  puVar1 = (obj->Text).Data;
  size.x = 0.0;
  size.y = 0.0;
  IVar2 = InputTextCalcTextSizeW
                    (puVar1 + line_start_idx,puVar1 + obj->CurLenW,(ImWchar **)&size,(ImVec2 *)0x0,
                     true);
  r->x0 = 0.0;
  local_38 = IVar2.x;
  r->x1 = local_38;
  fStack_34 = IVar2.y;
  r->baseline_y_delta = fStack_34;
  r->ymin = 0.0;
  r->ymax = fStack_34;
  r->num_chars = (int)((long)size - (long)(puVar1 + line_start_idx) >> 1);
  return;
}

Assistant:

static void    STB_TEXTEDIT_LAYOUTROW(StbTexteditRow* r, STB_TEXTEDIT_STRING* obj, int line_start_idx)
{
    const ImWchar* text = obj->Text.Data;
    const ImWchar* text_remaining = NULL;
    const ImVec2 size = InputTextCalcTextSizeW(text + line_start_idx, text + obj->CurLenW, &text_remaining, NULL, true);
    r->x0 = 0.0f;
    r->x1 = size.x;
    r->baseline_y_delta = size.y;
    r->ymin = 0.0f;
    r->ymax = size.y;
    r->num_chars = (int)(text_remaining - (text + line_start_idx));
}